

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O1

double ON_ArrayDistance(int dim,double *A,double *B)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  switch(dim) {
  case 0:
    dVar2 = 0.0;
    goto LAB_004eef98;
  case 1:
    return ABS(*B - *A);
  case 2:
    dVar2 = ABS(*B - *A);
    dVar3 = ABS(B[1] - A[1]);
    if (dVar3 < dVar2) {
      dVar3 = (dVar3 / dVar2) * (dVar3 / dVar2) + 1.0;
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
LAB_004ef041:
      return dVar3 * dVar2;
    }
    if (dVar3 <= dVar2) {
      dVar3 = 1.4142135623730951;
      goto LAB_004ef041;
    }
    dVar2 = (dVar2 / dVar3) * (dVar2 / dVar3) + 1.0;
    if (0.0 <= dVar2) {
      dVar2 = SQRT(dVar2);
      goto LAB_004ef0cf;
    }
    break;
  case 3:
    dVar2 = *B - *A;
    dVar3 = ABS(dVar2);
    dVar5 = ABS(B[1] - A[1]);
    dVar4 = ABS(B[2] - A[2]);
    if (dVar3 < dVar5) {
      if (dVar4 <= dVar5) {
        dVar2 = (dVar3 / dVar5) * (dVar3 / dVar5) + (dVar4 / dVar5) * (dVar4 / dVar5) + 1.0;
        if (dVar2 < 0.0) {
          dVar2 = sqrt(dVar2);
        }
        else {
          dVar2 = SQRT(dVar2);
        }
        return dVar2 * dVar5;
      }
LAB_004eeff6:
      dVar2 = (dVar3 / dVar4) * (dVar3 / dVar4) + (dVar5 / dVar4) * (dVar5 / dVar4) + 1.0;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      return dVar4 * dVar2;
    }
    if (dVar3 < dVar4) goto LAB_004eeff6;
    if ((dVar2 == 0.0) && (!NAN(dVar2))) {
      return 0.0;
    }
    if (((dVar3 == dVar5) && (dVar3 == dVar4)) && (!NAN(dVar3) && !NAN(dVar4))) {
      dVar2 = 1.7320508075688772;
      goto LAB_004ef0cf;
    }
    dVar2 = (dVar5 / dVar3) * (dVar5 / dVar3) + (dVar4 / dVar3) * (dVar4 / dVar3) + 1.0;
    if (0.0 <= dVar2) {
      dVar2 = SQRT(dVar2);
      goto LAB_004ef0cf;
    }
    break;
  default:
    dVar2 = 0.0;
    lVar1 = 0;
    do {
      dVar2 = dVar2 + (B[lVar1] - A[lVar1]) * (B[lVar1] - A[lVar1]);
      lVar1 = lVar1 + 1;
    } while (dim != (int)lVar1);
LAB_004eef98:
    if (0.0 <= dVar2) {
      return SQRT(dVar2);
    }
    dVar2 = sqrt(dVar2);
    return dVar2;
  }
  dVar2 = sqrt(dVar2);
LAB_004ef0cf:
  return dVar2 * dVar3;
}

Assistant:

double ON_ArrayDistance(int dim, const double *A, const double *B)
{
  // returns sqrt((A-B)o(A-B))
  double a, b, c, len;
  switch(dim) {
  case 1:
    len = fabs(*B - *A); 
    break;
  case 2:
    a = fabs(*B++ - *A++); b = fabs(*B - *A);
    if (a > b) 
      {b /= a; len = a*sqrt(1.0+b*b);}
    else if (b > a) 
      {a /= b; len = b*sqrt(1.0+a*a);}
    else
      len = a*ON_SQRT2;
    break;
  case 3:
    a = fabs(*B++ - *A++); b = fabs(*B++ - *A++); c = fabs(*B - *A);
    if (a >= b) {
      if (a >= c) {
        if      (a == 0.0)         len = 0.0;
        else if (a == b && a == c) len = a*ON_SQRT3;
        else      {b /= a; c /= a; len = a*sqrt(1.0 + (b*b + c*c));}
      }
      else 
        {a /= c; b /= c; len = c*sqrt(1.0 + (a*a + b*b));}
    }
    else if (b >= c) 
      {a /= b; c /= b; len = b*sqrt(1.0 + (a*a + c*c));}
    else 
      {b /= c; a /= c; len = c*sqrt(1.0 + (a*a + b*b));}
    break;
  default:
    len = 0.0;
    while (dim--) {a = *B++ - *A++; len += a*a;}
    len = sqrt(len);
    break;
  }
  return len;
}